

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintThreeGeneric.cpp
# Opt level: O2

ChConstraintThreeGeneric * __thiscall
chrono::ChConstraintThreeGeneric::operator=
          (ChConstraintThreeGeneric *this,ChConstraintThreeGeneric *other)

{
  if (other != this) {
    ChConstraintThree::operator=(&this->super_ChConstraintThree,&other->super_ChConstraintThree);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,1,_1,1,1,_1>,Eigen::Matrix<double,1,_1,1,1,_1>>
              (&this->Cq_a,&other->Cq_a);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,1,_1,1,1,_1>,Eigen::Matrix<double,1,_1,1,1,_1>>
              (&this->Cq_b,&other->Cq_b);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,1,_1,1,1,_1>,Eigen::Matrix<double,1,_1,1,1,_1>>
              (&this->Cq_c,&other->Cq_c);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (&this->Eq_a,&other->Eq_a);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (&this->Eq_b,&other->Eq_b);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (&this->Eq_c,&other->Eq_c);
  }
  return this;
}

Assistant:

ChConstraintThreeGeneric& ChConstraintThreeGeneric::operator=(const ChConstraintThreeGeneric& other) {
    if (&other == this)
        return *this;

    // copy parent class data
    ChConstraintThree::operator=(other);

    Cq_a = other.Cq_a;
    Cq_b = other.Cq_b;
    Cq_c = other.Cq_c;
    Eq_a = other.Eq_a;
    Eq_b = other.Eq_b;
    Eq_c = other.Eq_c;

    return *this;
}